

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dashel-posix.cpp
# Opt level: O1

void __thiscall Dashel::SerialStream::SerialStream(SerialStream *this,string *targetName)

{
  _Base_ptr *pp_Var1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  string *psVar6;
  long lVar7;
  _Rb_tree_node_base *p_Var8;
  ostream *poVar9;
  int *piVar10;
  DashelException *pDVar11;
  _Rb_tree_node_base *p_Var12;
  _Self __tmp;
  int iFlags;
  string name;
  string devFileName;
  sigaction act;
  undefined4 local_12c;
  termios local_128;
  char *local_e8;
  ulong local_e0;
  char local_d8;
  undefined7 uStack_d7;
  _union_1457 local_c8;
  _Rb_tree_node_base local_c0 [4];
  
  pp_Var1 = &local_c0[0]._M_parent;
  local_c8 = (_union_1457)pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"ser","");
  Stream::Stream((Stream *)&this->field_0x1060,(string *)&local_c8);
  if ((_Base_ptr *)local_c8.sa_handler != pp_Var1) {
    operator_delete(local_c8.sa_handler,(ulong)((long)&(local_c0[0]._M_parent)->_M_color + 1));
  }
  local_c8 = (_union_1457)pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"ser","");
  *(undefined4 *)&this->field_0x8 = 0xffffffff;
  this->field_0xc = 0;
  *(undefined2 *)&this->field_0xe = 1;
  *(undefined8 *)&this->field_0x1010 = 0;
  *(undefined8 *)&this->field_0x1018 = 0;
  *(undefined8 *)this = 0x1220c8;
  *(undefined8 *)&this->field_0x1060 = 0x122130;
  if ((_Base_ptr *)local_c8.sa_handler != pp_Var1) {
    operator_delete(local_c8.sa_handler,(ulong)((long)&(local_c0[0]._M_parent)->_M_color + 1));
  }
  *(undefined ***)this = &PTR__SerialStream_00121fe0;
  *(undefined ***)&this->field_0x1060 = &PTR__SerialStream_00122048;
  ParameterSet::add((ParameterSet *)&this->field_0x1090,
                    "ser:port=1;baud=115200;stop=1;parity=none;fc=none;bits=8;dtr=true");
  ParameterSet::add((ParameterSet *)(&this->field_0x30 + *(long *)(*(long *)this + -0x18)),
                    (targetName->_M_dataplus)._M_p);
  local_e0 = 0;
  local_d8 = '\0';
  local_e8 = &local_d8;
  bVar3 = ParameterSet::isSet((ParameterSet *)(&this->field_0x30 + *(long *)(*(long *)this + -0x18))
                              ,"device");
  if (bVar3) {
    ParameterSet::addParam
              ((ParameterSet *)(&this->field_0x30 + *(long *)(*(long *)this + -0x18)),"device",
               (char *)0x0,true);
    ParameterSet::erase((ParameterSet *)(&this->field_0x30 + *(long *)(*(long *)this + -0x18)),
                        "port");
    ParameterSet::erase((ParameterSet *)(&this->field_0x30 + *(long *)(*(long *)this + -0x18)),
                        "name");
    ParameterSet::get_abi_cxx11_
              ((ParameterSet *)(&this->field_0x30 + *(long *)(*(long *)this + -0x18)),"device");
    std::__cxx11::string::_M_assign((string *)&local_e8);
  }
  else {
    bVar3 = ParameterSet::isSet((ParameterSet *)
                                (&this->field_0x30 + *(long *)(*(long *)this + -0x18)),"name");
    if (bVar3) {
      ParameterSet::addParam
                ((ParameterSet *)(&this->field_0x30 + *(long *)(*(long *)this + -0x18)),"name",
                 (char *)0x0,true);
      ParameterSet::erase((ParameterSet *)(&this->field_0x30 + *(long *)(*(long *)this + -0x18)),
                          "port");
      ParameterSet::erase((ParameterSet *)(&this->field_0x30 + *(long *)(*(long *)this + -0x18)),
                          "device");
      psVar6 = ParameterSet::get_abi_cxx11_
                         ((ParameterSet *)(&this->field_0x30 + *(long *)(*(long *)this + -0x18)),
                          "name");
      pcVar2 = (psVar6->_M_dataplus)._M_p;
      local_128._0_8_ = (char *)((long)&local_128 + 0x10U);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_128,pcVar2,pcVar2 + psVar6->_M_string_length);
      SerialPortEnumerator::getPorts_abi_cxx11_();
      for (p_Var8 = local_c0[0]._M_left; p_Var8 != local_c0;
          p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
        lVar7 = std::__cxx11::string::find((char *)&p_Var8[2]._M_parent,local_128._0_8_,0);
        if (lVar7 != -1) {
          std::__cxx11::string::_M_assign((string *)&local_e8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Found ",6);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(char *)local_128._0_8_,local_128._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9," on port ",9);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,local_e8,local_e0);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
          std::ostream::put((char)poVar9);
          std::ostream::flush();
          break;
        }
      }
      if (local_e0 == 0) {
        pDVar11 = (DashelException *)__cxa_allocate_exception(0x20);
        DashelException::DashelException
                  (pDVar11,ConnectionFailed,0,
                   "The specified name could not be find among the serial ports.",(Stream *)0x0);
        __cxa_throw(pDVar11,&DashelException::typeinfo,std::runtime_error::~runtime_error);
      }
      std::
      _Rb_tree<int,_std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)&local_c8);
      if ((char *)local_128._0_8_ != (char *)((long)&local_128 + 0x10U)) {
        operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
      }
    }
    else {
      ParameterSet::erase((ParameterSet *)(&this->field_0x30 + *(long *)(*(long *)this + -0x18)),
                          "device");
      ParameterSet::erase((ParameterSet *)(&this->field_0x30 + *(long *)(*(long *)this + -0x18)),
                          "name");
      SerialPortEnumerator::getPorts_abi_cxx11_();
      iVar4 = ParameterSet::get<int>
                        ((ParameterSet *)(&this->field_0x30 + *(long *)(*(long *)this + -0x18)),
                         "port");
      p_Var8 = local_c0;
      for (; local_c0[0]._M_parent != (_Rb_tree_node_base *)0x0;
          local_c0[0]._M_parent =
               (&(local_c0[0]._M_parent)->_M_left)[(int)local_c0[0]._M_parent[1]._M_color < iVar4])
      {
        if (iVar4 <= (int)local_c0[0]._M_parent[1]._M_color) {
          p_Var8 = local_c0[0]._M_parent;
        }
      }
      p_Var12 = local_c0;
      if ((p_Var8 != local_c0) && (p_Var12 = p_Var8, iVar4 < (int)p_Var8[1]._M_color)) {
        p_Var12 = local_c0;
      }
      if (p_Var12 == local_c0) {
        pDVar11 = (DashelException *)__cxa_allocate_exception(0x20);
        DashelException::DashelException
                  (pDVar11,ConnectionFailed,0,"The specified serial port does not exists.",
                   (Stream *)0x0);
        __cxa_throw(pDVar11,&DashelException::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::string::_M_replace_aux((ulong)&local_e8,0,local_e0,'\x01');
      std::
      _Rb_tree<int,_std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)&local_c8);
    }
  }
  iVar4 = open(local_e8,2);
  *(int *)&this->field_0x8 = iVar4;
  if (iVar4 == -1) {
    pDVar11 = (DashelException *)__cxa_allocate_exception(0x20);
    piVar10 = __errno_location();
    DashelException::DashelException
              (pDVar11,ConnectionFailed,*piVar10,"Cannot open serial port.",(Stream *)0x0);
    __cxa_throw(pDVar11,&DashelException::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar4 = flock(iVar4,6);
  if (iVar4 != 0) {
    close(*(int *)&this->field_0x8);
    pDVar11 = (DashelException *)__cxa_allocate_exception(0x20);
    piVar10 = __errno_location();
    DashelException::DashelException
              (pDVar11,ConnectionFailed,*piVar10,"Cannot lock serial port.",(Stream *)0x0);
    __cxa_throw(pDVar11,&DashelException::typeinfo,std::runtime_error::~runtime_error);
  }
  tcgetattr(*(int *)&this->field_0x8,(termios *)&this->oldtio);
  local_128.c_iflag = 0;
  local_128.c_oflag = 0;
  local_128.c_line = '\0';
  local_128.c_cc[0] = '\0';
  local_128.c_cc[1] = '\0';
  local_128.c_cc[2] = '\0';
  local_128.c_cc[3] = '\0';
  local_128.c_cc[4] = '\0';
  local_128.c_cc[5] = '\0';
  local_128.c_cc[6] = '\0';
  local_128.c_cc[7] = '\0';
  local_128.c_cc[8] = '\0';
  local_128.c_cc[9] = '\0';
  local_128.c_cc[10] = '\0';
  local_128.c_cc[0xb] = '\0';
  local_128.c_cc[0xc] = '\0';
  local_128.c_cc[0xd] = '\0';
  local_128.c_cc[0xe] = '\0';
  local_128.c_cc[0xf] = '\0';
  local_128.c_cc[0x10] = '\0';
  local_128.c_cc[0x11] = '\0';
  local_128.c_cc[0x12] = '\0';
  local_128.c_cc[0x13] = '\0';
  local_128.c_cc[0x14] = '\0';
  local_128.c_cc[0x15] = '\0';
  local_128.c_cc[0x16] = '\0';
  local_128.c_cc[0x17] = '\0';
  local_128.c_cc[0x18] = '\0';
  local_128.c_cc[0x19] = '\0';
  local_128.c_cc[0x1a] = '\0';
  local_128.c_cc[0x1b] = '\0';
  local_128.c_cc[0x1c] = '\0';
  local_128.c_cc[0x1d] = '\0';
  local_128.c_cc[0x1e] = '\0';
  local_128.c_cc[0x1f] = '\0';
  local_128._49_3_ = 0;
  local_128.c_ispeed = 0;
  local_128.c_ospeed = 0;
  local_128.c_cflag = 0x880;
  local_128.c_lflag = 0;
  iVar4 = ParameterSet::get<int>
                    ((ParameterSet *)(&this->field_0x30 + *(long *)(*(long *)this + -0x18)),"bits");
  switch(iVar4) {
  case 5:
    goto switchD_00115253_caseD_5;
  case 6:
    uVar5 = 0x10;
    break;
  case 7:
    uVar5 = 0x20;
    break;
  case 8:
    uVar5 = 0x30;
    break;
  default:
    pDVar11 = (DashelException *)__cxa_allocate_exception(0x20);
    DashelException::DashelException
              (pDVar11,InvalidTarget,0,
               "Invalid number of bits per character, must be 5, 6, 7, or 8.",(Stream *)0x0);
    goto LAB_00115715;
  }
  local_128.c_cflag = local_128.c_cflag | uVar5;
switchD_00115253_caseD_5:
  psVar6 = ParameterSet::get_abi_cxx11_
                     ((ParameterSet *)(&this->field_0x30 + *(long *)(*(long *)this + -0x18)),"stop")
  ;
  iVar4 = std::__cxx11::string::compare((char *)psVar6);
  if (iVar4 == 0) {
    local_128._8_8_ = local_128._8_8_ | 0x40;
  }
  psVar6 = ParameterSet::get_abi_cxx11_
                     ((ParameterSet *)(&this->field_0x30 + *(long *)(*(long *)this + -0x18)),"fc");
  iVar4 = std::__cxx11::string::compare((char *)psVar6);
  if (iVar4 == 0) {
    local_128._8_8_ = local_128._8_8_ | 0x80000000;
  }
  psVar6 = ParameterSet::get_abi_cxx11_
                     ((ParameterSet *)(&this->field_0x30 + *(long *)(*(long *)this + -0x18)),
                      "parity");
  iVar4 = std::__cxx11::string::compare((char *)psVar6);
  if (iVar4 != 0) {
    local_128._8_8_ = local_128._8_8_ | 0x100;
    psVar6 = ParameterSet::get_abi_cxx11_
                       ((ParameterSet *)(&this->field_0x30 + *(long *)(*(long *)this + -0x18)),
                        "parity");
    iVar4 = std::__cxx11::string::compare((char *)psVar6);
    if (iVar4 == 0) {
      local_128._8_8_ = local_128._8_8_ | 0x200;
    }
  }
  iVar4 = ParameterSet::get<int>
                    ((ParameterSet *)(&this->field_0x30 + *(long *)(*(long *)this + -0x18)),"baud");
  if (iVar4 < 0x9600) {
    if (299 < iVar4) {
      if (iVar4 < 0x960) {
        if (iVar4 < 0x4b0) {
          if (iVar4 == 300) {
            uVar5 = 7;
          }
          else {
            if (iVar4 != 600) goto LAB_00115861;
            uVar5 = 8;
          }
        }
        else if (iVar4 == 0x4b0) {
          uVar5 = 9;
        }
        else {
          if (iVar4 != 0x708) goto LAB_00115861;
          uVar5 = 10;
        }
      }
      else if (iVar4 < 0x2580) {
        if (iVar4 == 0x960) {
          uVar5 = 0xb;
        }
        else {
          if (iVar4 != 0x12c0) goto LAB_00115861;
          uVar5 = 0xc;
        }
      }
      else if (iVar4 == 0x2580) {
        uVar5 = 0xd;
      }
      else {
        if (iVar4 != 0x4b00) goto LAB_00115861;
        uVar5 = 0xe;
      }
      goto LAB_00115618;
    }
    if (0x6d < iVar4) {
      if (iVar4 < 0x96) {
        if (iVar4 == 0x6e) {
          uVar5 = 3;
        }
        else {
          if (iVar4 != 0x86) goto LAB_00115861;
          uVar5 = 4;
        }
      }
      else if (iVar4 == 0x96) {
        uVar5 = 5;
      }
      else {
        if (iVar4 != 200) goto LAB_00115861;
        uVar5 = 6;
      }
      goto LAB_00115618;
    }
    if (iVar4 != 0) {
      uVar5 = 1;
      if (iVar4 != 0x32) {
        if (iVar4 != 0x4b) goto LAB_00115861;
        uVar5 = 2;
      }
      goto LAB_00115618;
    }
  }
  else {
    if (iVar4 < 1000000) {
      if (iVar4 < 0x70800) {
        if (iVar4 < 0x1c200) {
          if (iVar4 == 0x9600) {
            uVar5 = 0xf;
          }
          else {
            if (iVar4 != 0xe100) {
LAB_00115861:
              pDVar11 = (DashelException *)__cxa_allocate_exception(0x20);
              DashelException::DashelException
                        (pDVar11,ConnectionFailed,0,"Invalid baud rate.",(Stream *)0x0);
              goto LAB_00115715;
            }
            uVar5 = 0x1001;
          }
        }
        else if (iVar4 == 0x1c200) {
          uVar5 = 0x1002;
        }
        else {
          if (iVar4 != 0x38400) goto LAB_00115861;
          uVar5 = 0x1003;
        }
      }
      else if (iVar4 < 0x8ca00) {
        if (iVar4 == 0x70800) {
          uVar5 = 0x1004;
        }
        else {
          if (iVar4 != 500000) goto LAB_00115861;
          uVar5 = 0x1005;
        }
      }
      else if (iVar4 == 0x8ca00) {
        uVar5 = 0x1006;
      }
      else {
        if (iVar4 != 0xe1000) goto LAB_00115861;
        uVar5 = 0x1007;
      }
    }
    else if (iVar4 < 2500000) {
      if (iVar4 < 1500000) {
        if (iVar4 == 1000000) {
          uVar5 = 0x1008;
        }
        else {
          if (iVar4 != 0x119400) goto LAB_00115861;
          uVar5 = 0x1009;
        }
      }
      else if (iVar4 == 1500000) {
        uVar5 = 0x100a;
      }
      else {
        if (iVar4 != 2000000) goto LAB_00115861;
        uVar5 = 0x100b;
      }
    }
    else if (iVar4 < 3500000) {
      if (iVar4 == 2500000) {
        uVar5 = 0x100c;
      }
      else {
        if (iVar4 != 3000000) goto LAB_00115861;
        uVar5 = 0x100d;
      }
    }
    else if (iVar4 == 3500000) {
      uVar5 = 0x100e;
    }
    else {
      if (iVar4 != 4000000) goto LAB_00115861;
      uVar5 = 0x100f;
    }
LAB_00115618:
    local_128.c_lflag = 0;
    local_128.c_cflag = local_128.c_cflag | uVar5;
  }
  local_128.c_iflag = 4;
  local_128.c_oflag = 0;
  local_128._8_8_ = local_128._8_8_ & 0xffffffff;
  local_128.c_cc._5_2_ = 0x100;
  iVar4 = tcflush(*(int *)&this->field_0x8,2);
  if ((-1 < iVar4) && (iVar4 = tcsetattr(*(int *)&this->field_0x8,0,&local_128), -1 < iVar4)) {
    local_12c = 2;
    bVar3 = ParameterSet::get<bool>
                      ((ParameterSet *)(&this->field_0x30 + *(long *)(*(long *)this + -0x18)),"dtr")
    ;
    ioctl(*(int *)&this->field_0x8,(ulong)bVar3 ^ 0x5417,&local_12c);
    memset(&local_c8,0,0x98);
    local_c8 = (_union_1457)0x1;
    sigaction(1,(sigaction *)&local_c8,(sigaction *)0x0);
    if (local_e8 != &local_d8) {
      operator_delete(local_e8,CONCAT71(uStack_d7,local_d8) + 1);
    }
    return;
  }
  pDVar11 = (DashelException *)__cxa_allocate_exception(0x20);
  DashelException::DashelException
            (pDVar11,ConnectionFailed,0,
             "Cannot setup serial port. The requested baud rate might not be supported.",
             (Stream *)0x0);
LAB_00115715:
  __cxa_throw(pDVar11,&DashelException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

explicit SerialStream(const string& targetName) :
			Stream("ser"),
			FileDescriptorStream("ser")
		{
			target.add("ser:port=1;baud=115200;stop=1;parity=none;fc=none;bits=8;dtr=true");
			target.add(targetName.c_str());
			string devFileName;

			if (target.isSet("device"))
			{
				target.addParam("device", NULL, true);
				target.erase("port");
				target.erase("name");

				devFileName = target.get("device");
			}
			else if (target.isSet("name"))
			{
				target.addParam("name", NULL, true);
				target.erase("port");
				target.erase("device");

				// Enumerates the ports
				std::string name = target.get("name");
				std::map<int, std::pair<std::string, std::string> > ports = SerialPortEnumerator::getPorts();

				// Iterate on all ports to found one with "name" in its description
				std::map<int, std::pair<std::string, std::string> >::iterator it;
				for (it = ports.begin(); it != ports.end(); it++)
				{
					if (it->second.second.find(name) != std::string::npos)
					{
						devFileName = it->second.first;
						std::cout << "Found " << name << " on port " << devFileName << std::endl;
						break;
					}
				}
				if (devFileName.size() == 0)
					throw DashelException(DashelException::ConnectionFailed, 0, "The specified name could not be find among the serial ports.");
			}
			else // port
			{
				target.erase("device");
				target.erase("name");

				std::map<int, std::pair<std::string, std::string> > ports = SerialPortEnumerator::getPorts();
				std::map<int, std::pair<std::string, std::string> >::const_iterator it = ports.find(target.get<int>("port"));
				if (it != ports.end())
				{
					devFileName = it->first;
				}
				else
					throw DashelException(DashelException::ConnectionFailed, 0, "The specified serial port does not exists.");
			}

			fd = open(devFileName.c_str(), O_RDWR);
			if (fd == -1)
				throw DashelException(DashelException::ConnectionFailed, errno, "Cannot open serial port.");

			int lockRes = flock(fd, LOCK_EX | LOCK_NB);
			if (lockRes != 0)
			{
				close(fd);
				throw DashelException(DashelException::ConnectionFailed, errno, "Cannot lock serial port.");
			}

			struct termios newtio;

			// save old serial port state and clear new one
			tcgetattr(fd, &oldtio);
			memset(&newtio, 0, sizeof(newtio));

			newtio.c_cflag |= CLOCAL; // ignore modem control lines.
			newtio.c_cflag |= CREAD; // enable receiver.
			switch (target.get<int>("bits")) // Set amount of bits per character
			{
				case 5: newtio.c_cflag |= CS5; break;
				case 6: newtio.c_cflag |= CS6; break;
				case 7: newtio.c_cflag |= CS7; break;
				case 8: newtio.c_cflag |= CS8; break;
				default: throw DashelException(DashelException::InvalidTarget, 0, "Invalid number of bits per character, must be 5, 6, 7, or 8.");
			}
			if (target.get("stop") == "2")
				newtio.c_cflag |= CSTOPB; // Set two stop bits, rather than one.
			if (target.get("fc") == "hard")
				newtio.c_cflag |= CRTSCTS; // enable hardware flow control
			if (target.get("parity") != "none")
			{
				newtio.c_cflag |= PARENB; // enable parity generation on output and parity checking for input.
				if (target.get("parity") == "odd")
					newtio.c_cflag |= PARODD; // parity for input and output is odd.
			}

#ifdef MACOSX
			if (cfsetspeed(&newtio, target.get<int>("baud")) != 0)
				throw DashelException(DashelException::ConnectionFailed, errno, "Invalid baud rate.");
#else
			switch (target.get<int>("baud"))
			{
				case 0: newtio.c_cflag |= B0; break;
				case 50: newtio.c_cflag |= B50; break;
				case 75: newtio.c_cflag |= B75; break;
				case 110: newtio.c_cflag |= B110; break;
				case 134: newtio.c_cflag |= B134; break;
				case 150: newtio.c_cflag |= B150; break;
				case 200: newtio.c_cflag |= B200; break;
				case 300: newtio.c_cflag |= B300; break;
				case 600: newtio.c_cflag |= B600; break;
				case 1200: newtio.c_cflag |= B1200; break;
				case 1800: newtio.c_cflag |= B1800; break;
				case 2400: newtio.c_cflag |= B2400; break;
				case 4800: newtio.c_cflag |= B4800; break;
				case 9600: newtio.c_cflag |= B9600; break;
				case 19200: newtio.c_cflag |= B19200; break;
				case 38400: newtio.c_cflag |= B38400; break;
				case 57600: newtio.c_cflag |= B57600; break;
				case 115200: newtio.c_cflag |= B115200; break;
				case 230400: newtio.c_cflag |= B230400; break;
				case 460800: newtio.c_cflag |= B460800; break;
				case 500000: newtio.c_cflag |= B500000; break;
				case 576000: newtio.c_cflag |= B576000; break;
				case 921600: newtio.c_cflag |= B921600; break;
				case 1000000: newtio.c_cflag |= B1000000; break;
				case 1152000: newtio.c_cflag |= B1152000; break;
				case 1500000: newtio.c_cflag |= B1500000; break;
				case 2000000: newtio.c_cflag |= B2000000; break;
#ifdef B2500000
				case 2500000: newtio.c_cflag |= B2500000; break;
#endif // B2500000
#ifdef B3000000
				case 3000000: newtio.c_cflag |= B3000000; break;
#endif // B3000000
#ifdef B3500000
				case 3500000: newtio.c_cflag |= B3500000; break;
#endif // B3500000
#ifdef B4000000
				case 4000000: newtio.c_cflag |= B4000000; break;
#endif // B4000000
				default: throw DashelException(DashelException::ConnectionFailed, 0, "Invalid baud rate.");
			}
#endif

			newtio.c_iflag = IGNPAR; // ignore parity on input

			newtio.c_oflag = 0;

			newtio.c_lflag = 0;

			newtio.c_cc[VTIME] = 0; // block forever if no byte
			newtio.c_cc[VMIN] = 1; // one byte is sufficient to return

			// set attributes
			if ((tcflush(fd, TCIOFLUSH) < 0) || (tcsetattr(fd, TCSANOW, &newtio) < 0))
				throw DashelException(DashelException::ConnectionFailed, 0, "Cannot setup serial port. The requested baud rate might not be supported.");

			// Enable or disable DTR
			int iFlags = TIOCM_DTR;
			if (target.get<bool>("dtr"))
				ioctl(fd, TIOCMBIS, &iFlags);
			else
				ioctl(fd, TIOCMBIC, &iFlags);

			//Ignore SIGHUP from this point ownward, as it may be emitted and lead to a crash on some POSIX
			//implementations, despite CLOCAL being set
			//TODO: we should probably reset the signal to its initial state when all devices are disconnected.
			struct sigaction act;
			memset(&act, 0, sizeof(act));
			act.sa_handler = SIG_IGN;
			sigaction(SIGHUP, &act, NULL);
		}